

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *
testing::internal::ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>>::
PerformAction<std::experimental::fundamentals_v1::optional<InotifyEvent>()>
          (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *this;
  Result local_78;
  ReferenceOrValueWrapper<std::experimental::fundamentals_v1::optional<InotifyEvent>_> local_48;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *)
         operator_new(0x38);
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
            (&local_78,
             (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *)args_local,
             local_18);
  ReferenceOrValueWrapper<std::experimental::fundamentals_v1::optional<InotifyEvent>_>::
  ReferenceOrValueWrapper(&local_48,&local_78);
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_>::
  ActionResultHolder(this,&local_48);
  ReferenceOrValueWrapper<std::experimental::fundamentals_v1::optional<InotifyEvent>_>::
  ~ReferenceOrValueWrapper(&local_48);
  std::experimental::fundamentals_v1::optional<InotifyEvent>::~optional(&local_78);
  return this;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }